

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

String * kj::operator*(String *__return_storage_ptr__,long param_2)

{
  Array<char> *other;
  undefined8 *puVar1;
  kj *this;
  ArrayPtr<void_*const> trace;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  size_t extraout_RDX;
  char (*pacVar5) [2];
  ulong uVar6;
  StringPtr filename;
  ArrayPtr<void_*const> trace_00;
  char (*pacVar7) [2];
  undefined4 uVar8;
  undefined4 uVar9;
  Array<kj::String> contextText;
  ArrayPtr<const_char> local_b8;
  undefined1 local_a0 [16];
  char *local_90;
  undefined1 local_88 [8];
  Array<char> local_80;
  char *local_68;
  ulong local_60;
  char *local_58;
  ulong local_50;
  Array<char> local_48;
  
  uVar2 = 0;
  pacVar5 = (char (*) [2])(param_2 + 0x48);
  for (pacVar7 = pacVar5; pacVar7 = *(char (**) [2])pacVar7, pacVar7 != (char (*) [2])0x0;
      pacVar7 = pacVar7 + 0x18) {
    uVar2 = uVar2 + 1;
  }
  contextText.ptr = _::HeapArrayDisposer::allocate<kj::String>((ulong)uVar2);
  contextText.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  uVar6 = 0;
  other = (Array<char> *)(local_88 + 8);
  contextText.size_ = (ulong)uVar2;
  while (puVar1 = *(undefined8 **)pacVar5, puVar1 != (undefined8 *)0x0) {
    this = (kj *)*puVar1;
    sVar3 = strlen((char *)this);
    pacVar7 = (char (*) [2])0x194187;
    filename.content.size_ = extraout_RDX;
    filename.content.ptr = (char *)(sVar3 + 1);
    local_b8 = (ArrayPtr<const_char>)trimSourceFilename(this,filename);
    str<kj::StringPtr,char_const(&)[2],int_const&,char_const(&)[12],kj::String_const&,char_const(&)[2]>
              ((String *)other,(kj *)&local_b8,(StringPtr *)0x1bf197,(char (*) [2])(puVar1 + 1),
               (int *)": context: ",(char (*) [12])(puVar1 + 2),(String *)0x1cf110,pacVar7);
    Array<char>::operator=(&contextText.ptr[uVar6].content,other);
    uVar6 = (ulong)((int)uVar6 + 1);
    Array<char>::~Array(other);
    pacVar5 = (char (*) [2])(puVar1 + 6);
  }
  strArray<kj::Array<kj::String>&>
            ((String *)(local_88 + 8),(kj *)&contextText,(Array<kj::String> *)0x1cf111,*pacVar7);
  local_88 = *(undefined1 (*) [8])(param_2 + 0x18);
  uVar9 = *(undefined4 *)(param_2 + 0x20);
  uVar8 = *(undefined4 *)(param_2 + 0x24);
  uVar6 = *(ulong *)(param_2 + 0x30);
  local_58 = "";
  if (uVar6 != 0) {
    local_58 = *(char **)(param_2 + 0x28);
  }
  local_50 = uVar6;
  if (uVar6 < 2) {
    local_50 = 1;
  }
  local_90 = ": ";
  if (uVar6 < 2) {
    local_90 = "";
  }
  uVar6 = *(ulong *)(param_2 + 0x58);
  pcVar4 = "";
  if (uVar6 != 0) {
    pcVar4 = *(char **)(param_2 + 0x50);
  }
  local_60 = 1;
  if (1 < uVar6) {
    local_60 = uVar6;
  }
  local_a0._8_8_ = "\nremote: ";
  if (1 >= uVar6) {
    local_a0._8_8_ = "";
  }
  local_a0._0_8_ = "\nstack: ";
  if (*(int *)(param_2 + 0x168) == 0) {
    local_a0._0_8_ = "";
  }
  trace.size_._0_4_ = uVar8;
  trace.ptr = (void **)0x1942ba;
  trace.size_._4_4_ = uVar9;
  local_68 = pcVar4;
  stringifyStackTraceAddresses(trace);
  trace_00.ptr = (void **)(ulong)*(uint *)(param_2 + 0x168);
  trace_00.size_ = (size_t)pcVar4;
  stringifyStackTrace((String *)&local_48,(kj *)(param_2 + 0x68),trace_00);
  str<kj::String,char_const*,char_const(&)[2],int,char_const(&)[3],kj::Exception::Type,char_const*,kj::StringPtr,char_const*,kj::StringPtr,char_const*,kj::String,kj::String>
            (__return_storage_ptr__,(kj *)(local_88 + 8),(String *)local_88,(char **)0x1bf197,
             (char (*) [2])&stack0xffffffffffffff1c,(int *)0x1c1f42,
             (char (*) [3])&stack0xffffffffffffff18,(Type *)&local_90,&local_58,
             (StringPtr *)(local_a0 + 8),&local_68,(StringPtr *)local_a0,&local_b8.ptr,
             (String *)&local_48,(String *)CONCAT44(uVar9,uVar8));
  Array<char>::~Array(&local_48);
  Array<char>::~Array((Array<char> *)&local_b8);
  Array<char>::~Array((Array<char> *)(local_88 + 8));
  Array<kj::String>::~Array(&contextText);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(const Exception& e) {
  uint contextDepth = 0;

  Maybe<const Exception::Context&> contextPtr = e.getContext();
  for (;;) {
    KJ_IF_SOME(c, contextPtr) {
      ++contextDepth;
      contextPtr = c.next;
    } else {
      break;
    }
  }